

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demoend_playground.cpp
# Opt level: O0

void __thiscall cdplayer::add_transitions(cdplayer *this,state_machine<cdplayer> *sm)

{
  state_conditions *psVar1;
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  code *local_68;
  undefined8 local_60;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  code *local_38;
  undefined8 local_30;
  code *local_28;
  undefined8 local_20;
  state_machine<cdplayer> *local_18;
  state_machine<cdplayer> *sm_local;
  cdplayer *this_local;
  
  local_18 = sm;
  sm_local = (state_machine<cdplayer> *)this;
  psVar1 = estl::state_machine<cdplayer>::transitions_from(sm,off);
  psVar1 = estl::state_machine<cdplayer>::state_conditions::switch_to(psVar1,on);
  local_28 = power_toggle;
  local_20 = 0;
  psVar1 = estl::state_machine<cdplayer>::state_conditions::when
                     (psVar1,(sm_condition_memfun *)&local_28);
  estl::state_machine<cdplayer>::state_conditions::otherwise_loop(psVar1);
  psVar1 = estl::state_machine<cdplayer>::transitions_from(local_18,on);
  psVar1 = estl::state_machine<cdplayer>::state_conditions::switch_to(psVar1,off);
  local_38 = power_toggle;
  local_30 = 0;
  psVar1 = estl::state_machine<cdplayer>::state_conditions::when
                     (psVar1,(sm_condition_memfun *)&local_38);
  psVar1 = estl::state_machine<cdplayer>::state_conditions::switch_to(psVar1,playing);
  local_48 = play_pressed;
  local_40 = 0;
  psVar1 = estl::state_machine<cdplayer>::state_conditions::when
                     (psVar1,(sm_condition_memfun *)&local_48);
  estl::state_machine<cdplayer>::state_conditions::otherwise_loop(psVar1);
  psVar1 = estl::state_machine<cdplayer>::transitions_from(local_18,playing);
  psVar1 = estl::state_machine<cdplayer>::state_conditions::switch_to(psVar1,off);
  local_58 = power_toggle;
  local_50 = 0;
  psVar1 = estl::state_machine<cdplayer>::state_conditions::when
                     (psVar1,(sm_condition_memfun *)&local_58);
  psVar1 = estl::state_machine<cdplayer>::state_conditions::switch_to(psVar1,paused);
  local_68 = play_pressed;
  local_60 = 0;
  psVar1 = estl::state_machine<cdplayer>::state_conditions::when
                     (psVar1,(sm_condition_memfun *)&local_68);
  estl::state_machine<cdplayer>::state_conditions::otherwise_loop(psVar1);
  psVar1 = estl::state_machine<cdplayer>::transitions_from(local_18,paused);
  psVar1 = estl::state_machine<cdplayer>::state_conditions::switch_to(psVar1,off);
  local_78 = power_toggle;
  local_70 = 0;
  psVar1 = estl::state_machine<cdplayer>::state_conditions::when
                     (psVar1,(sm_condition_memfun *)&local_78);
  psVar1 = estl::state_machine<cdplayer>::state_conditions::switch_to(psVar1,playing);
  local_88 = play_pressed;
  local_80 = 0;
  psVar1 = estl::state_machine<cdplayer>::state_conditions::when
                     (psVar1,(sm_condition_memfun *)&local_88);
  estl::state_machine<cdplayer>::state_conditions::otherwise_loop(psVar1);
  return;
}

Assistant:

void add_transitions(estl::state_machine<cdplayer>& sm)
    {
        // --- Transitions from off ---
        sm.transitions_from(state_type::off)
                .switch_to(state_type::on).when(&cdplayer::power_toggle)
                .otherwise_loop();

        // --- Transitions from on ---
        sm.transitions_from(state_type::on)
                .switch_to(state_type::off).when(&cdplayer::power_toggle)
                .switch_to(state_type::playing).when(&cdplayer::play_pressed)
                .otherwise_loop();

        // --- Transitions from playing ---
        sm.transitions_from(state_type::playing)
                .switch_to(state_type::off).when(&cdplayer::power_toggle)
                .switch_to(state_type::paused).when(&cdplayer::play_pressed)
                .otherwise_loop();

        // --- Transitions from paused ---
        sm.transitions_from(state_type::paused)
                .switch_to(state_type::off).when(&cdplayer::power_toggle)
                .switch_to(state_type::playing).when(&cdplayer::play_pressed)
                .otherwise_loop();
    }